

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d.c
# Opt level: O1

void av1_fwd_txfm2d_64x16_c(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  TXFM_2D_FLIP_CFG cfg;
  int32_t txfm_buf [1024];
  TXFM_2D_FLIP_CFG TStack_1068;
  int32_t local_1028 [1024];
  
  av1_get_fwd_txfm_cfg(tx_type,'\x12',&TStack_1068);
  fwd_txfm2d_c(input,output,stride,&TStack_1068,local_1028,bd);
  memset(output + 0x200,0,0x800);
  return;
}

Assistant:

void av1_fwd_txfm2d_64x16_c(const int16_t *input, int32_t *output, int stride,
                            TX_TYPE tx_type, int bd) {
  int32_t txfm_buf[64 * 16];
  TXFM_2D_FLIP_CFG cfg;
  av1_get_fwd_txfm_cfg(tx_type, TX_64X16, &cfg);
  fwd_txfm2d_c(input, output, stride, &cfg, txfm_buf, bd);
  // Zero out the bottom 16x32 area.
  memset(output + 16 * 32, 0, 16 * 32 * sizeof(*output));
  // Note: no repacking needed here.
}